

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btJacobianEntry.h
# Opt level: O0

void __thiscall
btJacobianEntry::btJacobianEntry
          (btJacobianEntry *this,btVector3 *jointAxis,btMatrix3x3 *world2A,btMatrix3x3 *world2B,
          btVector3 *inertiaInvA,btVector3 *inertiaInvB)

{
  btVector3 *in_RCX;
  btVector3 *in_RDI;
  btScalar bVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 *this_00;
  btMatrix3x3 *m;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34 [5];
  btVector3 *local_20;
  
  local_34[0] = 0.0;
  local_38 = 0.0;
  local_3c = 0.0;
  local_20 = in_RCX;
  btVector3::btVector3(in_RDI,local_34,&local_38,&local_3c);
  this_00 = in_RDI + 1;
  btVector3::btVector3(this_00);
  m = (btMatrix3x3 *)(in_RDI + 2);
  btVector3::btVector3((btVector3 *)m);
  btVector3::btVector3(in_RDI + 3);
  btVector3::btVector3(in_RDI + 4);
  bVar3 = ::operator*(m,this_00);
  *(long *)in_RDI[1].m_floats = bVar3.m_floats._0_8_;
  *(long *)(in_RDI[1].m_floats + 2) = bVar3.m_floats._8_8_;
  operator-(local_20);
  bVar3 = ::operator*(m,this_00);
  *(long *)in_RDI[2].m_floats = bVar3.m_floats._0_8_;
  *(long *)(in_RDI[2].m_floats + 2) = bVar3.m_floats._8_8_;
  bVar3 = ::operator*(m->m_el,this_00);
  *(long *)in_RDI[3].m_floats = bVar3.m_floats._0_8_;
  *(long *)(in_RDI[3].m_floats + 2) = bVar3.m_floats._8_8_;
  bVar3 = ::operator*(m->m_el,this_00);
  *(long *)in_RDI[4].m_floats = bVar3.m_floats._0_8_;
  *(long *)(in_RDI[4].m_floats + 2) = bVar3.m_floats._8_8_;
  bVar1 = btVector3::dot(in_RDI + 3,in_RDI + 1);
  bVar2 = btVector3::dot(in_RDI + 4,in_RDI + 2);
  in_RDI[5].m_floats[0] = bVar1 + bVar2;
  return;
}

Assistant:

btJacobianEntry(const btVector3& jointAxis,
		const btMatrix3x3& world2A,
		const btMatrix3x3& world2B,
		const btVector3& inertiaInvA,
		const btVector3& inertiaInvB)
		:m_linearJointAxis(btVector3(btScalar(0.),btScalar(0.),btScalar(0.)))
	{
		m_aJ= world2A*jointAxis;
		m_bJ = world2B*-jointAxis;
		m_0MinvJt	= inertiaInvA * m_aJ;
		m_1MinvJt = inertiaInvB * m_bJ;
		m_Adiag =  m_0MinvJt.dot(m_aJ) + m_1MinvJt.dot(m_bJ);

		btAssert(m_Adiag > btScalar(0.0));
	}